

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O3

void __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::applyMerge(PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
             *this,size_t partitionIdA,size_t partitionIdB)

{
  PartitionGraph *this_00;
  pointer puVar1;
  ulong __n;
  _Hash_node_base *p_Var2;
  Data *pDVar3;
  _Hash_node_base *p_Var4;
  pointer pRVar5;
  _Hash_node_base *p_Var6;
  pointer pAVar7;
  _Hash_node_base *p_Var8;
  ulong uVar9;
  pointer puVar10;
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  *pPVar11;
  _Hash_node_base *p_Var12;
  _Hash_node_base *p_Var13;
  unsigned_long *v;
  pointer puVar14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3_1;
  _Hash_node_base *p_Var15;
  value_type *__range2;
  size_t partitionId;
  pointer pAVar16;
  difference_type __d;
  ulong uVar17;
  double dVar18;
  double extraout_XMM0_Qa;
  vector<unsigned_long,_std::allocator<unsigned_long>_> buffer;
  value_type *__range3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  size_t local_58;
  size_t local_50;
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  *local_48;
  pointer local_40;
  ulong local_38;
  
  puVar1 = (this->partitionGraph_).partitions_.
           super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __n = puVar1[partitionIdA]._M_h._M_element_count;
  if (__n != 0) {
    local_40 = puVar1 + partitionIdB;
    local_38 = (local_40->_M_h)._M_element_count;
    if (local_38 != 0) {
      p_Var13 = puVar1[partitionIdA]._M_h._M_before_begin._M_nxt;
      if (p_Var13 == (_Hash_node_base *)0x0) {
        dVar18 = 0.0;
      }
      else {
        p_Var2 = (local_40->_M_h)._M_before_begin._M_nxt;
        pDVar3 = (this->super_HeuristicBase).data_;
        dVar18 = 0.0;
        do {
          if (p_Var2 != (_Hash_node_base *)0x0) {
            p_Var4 = p_Var13[1]._M_nxt;
            pRVar5 = (pDVar3->problemGraph->graph_).vertices_.
                     super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            p_Var15 = p_Var2;
            do {
              p_Var6 = p_Var15[1]._M_nxt;
              p_Var12 = p_Var6;
              p_Var8 = p_Var4;
              if ((ulong)((long)pRVar5[(long)p_Var4].vector_.
                                super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         *(long *)&pRVar5[(long)p_Var4].vector_) <=
                  (ulong)((long)pRVar5[(long)p_Var6].vector_.
                                super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         *(long *)&pRVar5[(long)p_Var6].vector_)) {
                p_Var12 = p_Var4;
                p_Var8 = p_Var6;
              }
              pAVar16 = *(pointer *)&pRVar5[(long)p_Var12].vector_;
              pAVar7 = pRVar5[(long)p_Var12].vector_.
                       super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              uVar17 = (long)pAVar7 - (long)pAVar16 >> 4;
              while (uVar9 = uVar17, 0 < (long)uVar9) {
                uVar17 = uVar9 >> 1;
                if (*(_Hash_node_base **)(pAVar16 + uVar17) < p_Var8) {
                  pAVar16 = pAVar16 + uVar17 + 1;
                  uVar17 = ~uVar17 + uVar9;
                }
              }
              if ((pAVar7 != pAVar16) && ((_Hash_node_base *)pAVar16->vertex_ == p_Var8)) {
                dVar18 = dVar18 - (pDVar3->costs).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[pAVar16->edge_];
              }
              p_Var15 = p_Var15->_M_nxt;
            } while (p_Var15 != (_Hash_node_base *)0x0);
          }
          p_Var13 = p_Var13->_M_nxt;
        } while (p_Var13 != (_Hash_node_base *)0x0);
      }
      this->internalObjective_ = dVar18 + this->internalObjective_;
      local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (size_t *)0x0;
      local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
      local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
      local_58 = partitionIdB;
      local_50 = partitionIdA;
      local_48 = this;
      if (__n < local_38) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_78,__n);
        partitionId = local_58;
        for (p_Var13 = puVar1[partitionIdA]._M_h._M_before_begin._M_nxt; local_58 = partitionId,
            p_Var13 != (_Hash_node_base *)0x0; p_Var13 = p_Var13->_M_nxt) {
          if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_78,
                       (iterator)
                       local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)(p_Var13 + 1));
          }
          else {
            *local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)p_Var13[1]._M_nxt;
            local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          partitionId = local_58;
        }
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_78,local_38);
        partitionId = local_50;
        for (p_Var13 = (local_40->_M_h)._M_before_begin._M_nxt; local_50 = partitionId,
            p_Var13 != (_Hash_node_base *)0x0; p_Var13 = p_Var13->_M_nxt) {
          if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_78,
                       (iterator)
                       local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)(p_Var13 + 1));
          }
          else {
            *local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)p_Var13[1]._M_nxt;
            local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          partitionId = local_50;
        }
      }
      puVar10 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      this_00 = &local_48->partitionGraph_;
      for (puVar14 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start; puVar14 != puVar10;
          puVar14 = puVar14 + 1) {
        PartitionGraph::forceMove(this_00,*puVar14,partitionId);
      }
      PartitionGraph::updateEdgesOfPartition(this_00,local_50);
      PartitionGraph::updateEdgesOfPartition(this_00,local_58);
      pPVar11 = local_48;
      if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (size_t *)0x0) {
        operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      (*(pPVar11->super_HeuristicBase)._vptr_HeuristicBase[3])(pPVar11,partitionId,partitionId);
      pPVar11->branchingObjective_ =
           (extraout_XMM0_Qa - pPVar11->localBranchingObjective_) + pPVar11->branchingObjective_;
    }
  }
  return;
}

Assistant:

inline void
PartitionOptimizerBase<BROPT>::applyMerge(size_t partitionIdA,
                                          size_t partitionIdB)
{
    auto& partitionA = partitionGraph_.partitions_[partitionIdA];
    auto& partitionB = partitionGraph_.partitions_[partitionIdB];

    if (partitionA.empty() || partitionB.empty()) {
        return;
    }

    // calculate gain (in-frame) of merging.
    Cost dObj = .0;
    for (const auto& v : partitionA) {
        for (const auto& w : partitionB) {
            const auto p = this->data_.problemGraph.graph().findEdge(v, w);
            if (p.first) {
                dObj -= this->data_.costs[p.second];
            }
        }
    }
    internalObjective_ += dObj;

    // merge & update partitionGraph
    size_t otherId;
    {
        std::vector<size_t> buffer;
        if (partitionA.size() < partitionB.size()) {
            otherId = partitionIdB;

            buffer.reserve(partitionA.size());
            for (const auto& v : partitionA) {
                buffer.emplace_back(v);
            }
        } else {
            otherId = partitionIdA;

            buffer.reserve(partitionB.size());
            for (const auto& v : partitionB) {
                buffer.emplace_back(v);
            }
        }

        for (const auto& v : buffer) {
            partitionGraph_.forceMove(v, otherId);
        }

        partitionGraph_.updateEdgesOfPartition(partitionIdA);
        partitionGraph_.updateEdgesOfPartition(partitionIdB);
    }

    // calculate new branching.
    const auto localBranchingObj = solveLocalBranchingProblem(otherId, otherId);
    const auto dLocalBranchingObj =
        (localBranchingObj - localBranchingObjective_);

    branchingObjective_ += dLocalBranchingObj;
}